

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Addition.h
# Opt level: O2

ptr<Value> __thiscall Addition::asDoubles(Addition *this,double leftOperand,double rightOperand)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar2;
  Operation local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  double local_10;
  
  local_10 = leftOperand + rightOperand;
  std::make_shared<Double,double&>((double *)&local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Operation)._vptr_Operation = local_28._vptr_Operation;
  this[1].super_Operation._vptr_Operation = (_func_int **)_Var1._M_pi;
  local_28._vptr_Operation = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar2.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asDoubles(double leftOperand, double rightOperand) override {
        return make<Double>(leftOperand + rightOperand);
    }